

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O1

void Acec_ManPrintRanks(Vec_Int_t *vPairs)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int *__ptr;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  __ptr = (int *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar4 = malloc(400);
  *(void **)(__ptr + 2) = pvVar4;
  __ptr[1] = 100;
  if (pvVar4 != (void *)0x0) {
    memset(pvVar4,0,400);
  }
  uVar6 = 0;
  if (1 < vPairs->nSize) {
    uVar8 = __ptr[1];
    uVar6 = 0;
    lVar10 = 1;
    do {
      uVar2 = vPairs->pArray[lVar10];
      if ((int)uVar2 < (int)uVar8) {
        uVar5 = (ulong)uVar8;
      }
      else {
        uVar5 = (long)(int)uVar2 + 1;
        iVar3 = *__ptr;
        iVar7 = iVar3 * 2;
        if ((int)uVar2 < iVar7) {
          if (iVar3 < iVar7 && iVar3 <= (int)uVar2) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc((long)iVar3 << 3);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),(long)iVar3 << 3);
            }
            *(void **)(__ptr + 2) = pvVar4;
LAB_006676f3:
            if (pvVar4 == (void *)0x0) {
              __ptr[1] = uVar8;
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *__ptr = iVar7;
          }
        }
        else if (iVar3 <= (int)uVar2) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar4 = malloc(uVar5 * 4);
          }
          else {
            pvVar4 = realloc(*(void **)(__ptr + 2),uVar5 * 4);
          }
          *(void **)(__ptr + 2) = pvVar4;
          iVar7 = (int)uVar5;
          goto LAB_006676f3;
        }
        memset((void *)((long)(int)uVar8 * 4 + *(long *)(__ptr + 2)),0,
               (ulong)(uVar2 - uVar8) * 4 + 4);
      }
      uVar8 = (uint)uVar5;
      if (((int)uVar2 < 0) || ((int)uVar8 <= (int)uVar2)) {
        __ptr[1] = uVar8;
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (int *)(*(long *)(__ptr + 2) + (ulong)uVar2 * 4);
      *piVar1 = *piVar1 + 1;
      if ((int)uVar6 <= (int)uVar2) {
        uVar6 = uVar2;
      }
      lVar10 = lVar10 + 2;
    } while ((int)lVar10 < vPairs->nSize);
    __ptr[1] = uVar8;
  }
  if (0 < (int)uVar6) {
    uVar5 = 1;
    if (1 < __ptr[1]) {
      uVar5 = (ulong)(uint)__ptr[1];
    }
    uVar9 = 1;
    do {
      if (uVar5 == uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      printf("%2d=%2d ",uVar9 & 0xffffffff,(ulong)*(uint *)(*(long *)(__ptr + 2) + uVar9 * 4));
      uVar9 = uVar9 + 1;
    } while (uVar6 + 1 != uVar9);
  }
  putchar(10);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Acec_ManPrintRanks( Vec_Int_t * vPairs )
{
    int k, iObj, Count, Rank, RankMax = 0;
    Vec_Int_t * vCounts = Vec_IntStart( 100 );
    Vec_IntForEachEntryDouble( vPairs, iObj, Rank, k )
    {
        Vec_IntFillExtra( vCounts, Rank+1, 0 );
        Vec_IntAddToEntry( vCounts, Rank, 1 );
        RankMax = Abc_MaxInt( RankMax, Rank );
    }
    Vec_IntForEachEntryStartStop( vCounts, Count, Rank, 1, RankMax+1 )
        printf( "%2d=%2d ", Rank, Count );
    printf( "\n" );
    Vec_IntFree( vCounts );
}